

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

string * just::environment::impl::append_to_path
                   (string *__return_storage_ptr__,string *item_,string *path_)

{
  undefined8 __lhs;
  __type _Var1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  undefined1 local_40 [8];
  string sep;
  string *path__local;
  string *item__local;
  
  sep.field_2._8_8_ = path_;
  path_separator_abi_cxx11_();
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            sep.field_2._8_8_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
    __lhs = sep.field_2._8_8_;
    if (!_Var1) {
      bVar2 = ends_with((string *)sep.field_2._8_8_,(string *)local_40);
      if (bVar2) {
        std::operator+(&local_70,item_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
      }
      else {
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,item_);
      }
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_00103c56;
    }
  }
  std::operator+(__return_storage_ptr__,item_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 sep.field_2._8_8_);
LAB_00103c56:
  local_50 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string append_to_path(
        const std::string& item_,
        const std::string& path_
      )
      {
        const std::string sep = path_separator();

        if (path_.empty() || path_ == sep)
        {
          return item_ + path_;
        }
        else
        {
          return path_ + (ends_with(path_, sep) ? item_ + sep : sep + item_);
        }
      }